

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReader<long>(duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  PhysicalType PVar1;
  ColumnReader *this_00;
  undefined *puVar2;
  NotImplementedException *this_01;
  string local_48;
  
  PVar1 = (schema->type).physical_type_;
  if (PVar1 == INT64) {
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<long>>::vtable;
  }
  else if (PVar1 == INT32) {
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<long>>::vtable;
  }
  else {
    if (PVar1 != INT16) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unimplemented internal type for CreateDecimalReader","");
      NotImplementedException::NotImplementedException(this_01,&local_48);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    puVar2 = &TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<long>>::vtable;
  }
  this_00->_vptr_ColumnReader = (_func_int **)(puVar2 + 0x10);
  this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
  this_00[1].column_schema = (ParquetColumnSchema *)0x0;
  *(ColumnReader **)this = this_00;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	default:
		throw NotImplementedException("Unimplemented internal type for CreateDecimalReader");
	}
}